

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_xattrs(archive_write_disk *a)

{
  wchar_t wVar1;
  archive_write_disk *a_local;
  
  wVar1 = archive_entry_xattr_count(a->entry);
  if ((wVar1 == L'\0') || (set_xattrs::warning_done != L'\0')) {
    a_local._4_4_ = L'\0';
  }
  else {
    set_xattrs::warning_done = L'\x01';
    archive_set_error(&a->archive,0x54,"Cannot restore extended attributes on this system");
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
set_xattrs(struct archive_write_disk *a)
{
	static int warning_done = 0;

	/* If there aren't any extended attributes, then it's okay not
	 * to extract them, otherwise, issue a single warning. */
	if (archive_entry_xattr_count(a->entry) != 0 && !warning_done) {
		warning_done = 1;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore extended attributes on this system");
		return (ARCHIVE_WARN);
	}
	/* Warning was already emitted; suppress further warnings. */
	return (ARCHIVE_OK);
}